

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

bool __thiscall hanabi_learning_env::HanabiState::HintingIsLegal(HanabiState *this,HanabiMove move)

{
  int8_t iVar1;
  int iVar2;
  HanabiGame *this_00;
  HanabiState *in_RDI;
  HanabiMove local_c;
  
  iVar2 = InformationTokens(in_RDI);
  if ((0 < iVar2) && (iVar1 = HanabiMove::TargetOffset(&local_c), '\0' < iVar1)) {
    iVar1 = HanabiMove::TargetOffset(&local_c);
    this_00 = ParentGame(in_RDI);
    iVar2 = HanabiGame::NumPlayers(this_00);
    if (iVar1 < iVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool HanabiState::HintingIsLegal(HanabiMove move) const {
  if (InformationTokens() <= 0) {
    return false;
  }
  if (move.TargetOffset() < 1 ||
      move.TargetOffset() >= ParentGame()->NumPlayers()) {
    return false;
  }
  return true;
}